

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_client_close(http_server_t *server,http_client_t *client)

{
  int iVar1;
  int local_1c;
  int retval;
  http_client_t *client_local;
  http_server_t *server_local;
  
  local_1c = 0;
  if (client->fd != -1) {
    local_1c = close(client->fd);
  }
  http_client_init(client);
  server->count_clients = server->count_clients - 1;
  if (((server->count_clients <= server->num_clients >> 2) && (2 < server->num_clients)) &&
     (iVar1 = http_server_realloc(server,server->num_clients >> 1), iVar1 == 0)) {
    fprintf(_stderr,"Could not cut down the size of the server structure\n");
  }
  http_server_assert(server);
  return local_1c;
}

Assistant:

int http_client_close(http_server_t *server,
                      http_client_t *client) {
  int retval = 0;
  
  if (client->fd != -1) {
    retval = close(client->fd);
  }
  
  http_client_init(client);
  server->count_clients--;
  
  /* trim down memory size */
  if ((server->count_clients <= (server->num_clients / 4)) &&
      (server->num_clients > HTTP_MIN_CLIENTS)) {
    if (!http_server_realloc(server, server->num_clients / 2)) {
      /* not really critical */
      fprintf(stderr,
              "Could not cut down the size of the server structure\n");
    }
  }

  http_server_assert(server);
  
  return retval;
}